

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::clear_Type(Model *this)

{
  TypeCase TVar1;
  Model *this_local;
  
  TVar1 = Type_case(this);
  if (TVar1 != TYPE_NOT_SET) {
    if (TVar1 == kPipelineClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kPipelineRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kPipeline) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kGlmRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kSupportVectorRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kTreeEnsembleRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kNeuralNetworkRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kBayesianProbitRegressor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kGlmClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kSupportVectorClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kTreeEnsembleClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kNeuralNetworkClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kKNearestNeighborsClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kNeuralNetwork) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kItemSimilarityRecommender) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kCustomModel) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kLinkedModel) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kOneHotEncoder) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kImputer) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kFeatureVectorizer) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kDictVectorizer) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kScaler) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kCategoricalMapping) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kNormalizer) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kArrayFeatureExtractor) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kNonMaximumSuppression) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kIdentity) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kTextClassifier) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kWordTagger) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kVisionFeaturePrint) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kSoundAnalysisPreprocessing) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kGazetteer) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if (TVar1 == kWordEmbedding) {
      if ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0) {
        (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((TVar1 == kSerializedModel) &&
            ((this->Type_).pipelineclassifier_ != (PipelineClassifier *)0x0)) {
      (*(((this->Type_).pipelineclassifier_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Model::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Model)
  switch (Type_case()) {
    case kPipelineClassifier: {
      delete Type_.pipelineclassifier_;
      break;
    }
    case kPipelineRegressor: {
      delete Type_.pipelineregressor_;
      break;
    }
    case kPipeline: {
      delete Type_.pipeline_;
      break;
    }
    case kGlmRegressor: {
      delete Type_.glmregressor_;
      break;
    }
    case kSupportVectorRegressor: {
      delete Type_.supportvectorregressor_;
      break;
    }
    case kTreeEnsembleRegressor: {
      delete Type_.treeensembleregressor_;
      break;
    }
    case kNeuralNetworkRegressor: {
      delete Type_.neuralnetworkregressor_;
      break;
    }
    case kBayesianProbitRegressor: {
      delete Type_.bayesianprobitregressor_;
      break;
    }
    case kGlmClassifier: {
      delete Type_.glmclassifier_;
      break;
    }
    case kSupportVectorClassifier: {
      delete Type_.supportvectorclassifier_;
      break;
    }
    case kTreeEnsembleClassifier: {
      delete Type_.treeensembleclassifier_;
      break;
    }
    case kNeuralNetworkClassifier: {
      delete Type_.neuralnetworkclassifier_;
      break;
    }
    case kKNearestNeighborsClassifier: {
      delete Type_.knearestneighborsclassifier_;
      break;
    }
    case kNeuralNetwork: {
      delete Type_.neuralnetwork_;
      break;
    }
    case kItemSimilarityRecommender: {
      delete Type_.itemsimilarityrecommender_;
      break;
    }
    case kCustomModel: {
      delete Type_.custommodel_;
      break;
    }
    case kLinkedModel: {
      delete Type_.linkedmodel_;
      break;
    }
    case kOneHotEncoder: {
      delete Type_.onehotencoder_;
      break;
    }
    case kImputer: {
      delete Type_.imputer_;
      break;
    }
    case kFeatureVectorizer: {
      delete Type_.featurevectorizer_;
      break;
    }
    case kDictVectorizer: {
      delete Type_.dictvectorizer_;
      break;
    }
    case kScaler: {
      delete Type_.scaler_;
      break;
    }
    case kCategoricalMapping: {
      delete Type_.categoricalmapping_;
      break;
    }
    case kNormalizer: {
      delete Type_.normalizer_;
      break;
    }
    case kArrayFeatureExtractor: {
      delete Type_.arrayfeatureextractor_;
      break;
    }
    case kNonMaximumSuppression: {
      delete Type_.nonmaximumsuppression_;
      break;
    }
    case kIdentity: {
      delete Type_.identity_;
      break;
    }
    case kTextClassifier: {
      delete Type_.textclassifier_;
      break;
    }
    case kWordTagger: {
      delete Type_.wordtagger_;
      break;
    }
    case kVisionFeaturePrint: {
      delete Type_.visionfeatureprint_;
      break;
    }
    case kSoundAnalysisPreprocessing: {
      delete Type_.soundanalysispreprocessing_;
      break;
    }
    case kGazetteer: {
      delete Type_.gazetteer_;
      break;
    }
    case kWordEmbedding: {
      delete Type_.wordembedding_;
      break;
    }
    case kSerializedModel: {
      delete Type_.serializedmodel_;
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}